

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O2

int MetadataCopy(char *metadata,size_t metadata_len,MetadataPayload *payload)

{
  uint8_t *__dest;
  int iVar1;
  
  iVar1 = 0;
  if (payload != (MetadataPayload *)0x0 && (metadata_len != 0 && metadata != (char *)0x0)) {
    __dest = (uint8_t *)malloc(metadata_len);
    payload->bytes = __dest;
    if (__dest != (uint8_t *)0x0) {
      payload->size = metadata_len;
      memcpy(__dest,metadata,metadata_len);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int MetadataCopy(const char* metadata, size_t metadata_len,
                 MetadataPayload* const payload) {
  if (metadata == NULL || metadata_len == 0 || payload == NULL) return 0;
  payload->bytes = (uint8_t*)malloc(metadata_len);
  if (payload->bytes == NULL) return 0;
  payload->size = metadata_len;
  memcpy(payload->bytes, metadata, metadata_len);
  return 1;
}